

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O1

void duckdb::ConstantScanPartial<unsigned_long>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  undefined1 auVar2 [16];
  unsigned_long uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pdVar1 = result->data;
  uVar3 = NumericStats::GetMin<unsigned_long>(&(segment->stats).statistics);
  auVar2 = _DAT_01dd7b40;
  if (scan_count != 0) {
    lVar5 = scan_count - 1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_01dd7b40;
    auVar7 = _DAT_01dd7b30;
    do {
      auVar8 = auVar7 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(unsigned_long *)(pdVar1 + uVar4 * 8 + result_offset * 8) = uVar3;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(unsigned_long *)(pdVar1 + uVar4 * 8 + result_offset * 8 + 8) = uVar3;
      }
      uVar4 = uVar4 + 2;
      lVar5 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar5 + 2;
    } while ((scan_count + 1 & 0xfffffffffffffffe) != uVar4);
  }
  return;
}

Assistant:

void ConstantScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                         idx_t result_offset) {
	ConstantFillFunction<T>(segment, result, result_offset, scan_count);
}